

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O3

bool __thiscall CUI::OnInput(CUI *this,CEvent *e)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  
  if (this->m_Enabled != true) {
    return false;
  }
  if ((CLineInput::s_pActiveInput != (CLineInput *)0x0) &&
     (bVar2 = CLineInput::ProcessInput(CLineInput::s_pActiveInput,e), bVar2)) {
    return true;
  }
  if ((e->m_Flags & 1) == 0) {
    return false;
  }
  uVar1 = this->m_HotkeysPressed;
  iVar3 = e->m_Key;
  if (iVar3 < 0x1b) {
    if (iVar3 == 9) {
      iVar3 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x162);
      if (((char)iVar3 != '\0') ||
         (iVar3 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x166),
         (char)iVar3 != '\0')) {
        iVar3 = e->m_Key;
        goto LAB_0018a6a4;
      }
      uVar4 = this->m_HotkeysPressed | 0x20;
    }
    else if (iVar3 == 0xd) {
LAB_0018a66d:
      uVar4 = uVar1 | 1;
    }
    else {
LAB_0018a6a4:
      uVar4 = this->m_HotkeysPressed;
      if (iVar3 == 0xd2) {
        uVar4 = uVar4 | 4;
      }
      else if (iVar3 == 0xd1) {
        uVar4 = uVar4 | 8;
      }
      else {
        if (iVar3 != 0x7f) goto LAB_0018a6db;
        uVar4 = uVar4 | 0x10;
      }
    }
  }
  else {
    if (iVar3 != 0x1b) {
      if (iVar3 == 0xd8) goto LAB_0018a66d;
      goto LAB_0018a6a4;
    }
    uVar4 = uVar1 | 2;
  }
  this->m_HotkeysPressed = uVar4;
LAB_0018a6db:
  return uVar1 != uVar4;
}

Assistant:

bool CUI::OnInput(const IInput::CEvent &e)
{
	if(!Enabled())
		return false;

	CLineInput *pActiveInput = CLineInput::GetActiveInput();
	if(pActiveInput && pActiveInput->ProcessInput(e))
		return true;

	if(e.m_Flags&IInput::FLAG_PRESS)
	{
		unsigned LastHotkeysPressed = m_HotkeysPressed;
		if(e.m_Key == KEY_RETURN || e.m_Key == KEY_KP_ENTER)
			m_HotkeysPressed |= HOTKEY_ENTER;
		else if(e.m_Key == KEY_ESCAPE)
			m_HotkeysPressed |= HOTKEY_ESCAPE;
		else if(e.m_Key == KEY_TAB && !Input()->KeyIsPressed(KEY_LALT) && !Input()->KeyIsPressed(KEY_RALT))
			m_HotkeysPressed |= HOTKEY_TAB;
		else if(e.m_Key == KEY_DELETE)
			m_HotkeysPressed |= HOTKEY_DELETE;
		else if(e.m_Key == KEY_UP)
			m_HotkeysPressed |= HOTKEY_UP;
		else if(e.m_Key == KEY_DOWN)
			m_HotkeysPressed |= HOTKEY_DOWN;
		return LastHotkeysPressed != m_HotkeysPressed;
	}
	return false;
}